

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjToNumeric(jx9_value *pObj)

{
  sxi64 sVar1;
  SyString sString;
  sxu8 bReal;
  sxi32 rc;
  jx9_value *pObj_local;
  
  if ((pObj->iFlags & 0x2eU) == 0) {
    if ((pObj->iFlags & 1U) == 0) {
      if ((pObj->iFlags & 0x140U) == 0) {
        jx9MemObjToReal(pObj);
      }
      else {
        jx9MemObjToInteger(pObj);
      }
    }
    else {
      sString._12_4_ = 0xfffffff7;
      sString.nByte._3_1_ = '\0';
      sString.zString._0_4_ = (pObj->sBlob).nByte;
      if ((sxu32)sString.zString != 0) {
        sString._12_4_ =
             SyStrIsNumeric((char *)(pObj->sBlob).pBlob,(sxu32)sString.zString,
                            (sxu8 *)((long)&sString.nByte + 3),(char **)0x0);
      }
      if (sString.nByte._3_1_ == '\0') {
        if (sString._12_4_ == 0) {
          sVar1 = MemObjStringToInt(pObj);
          (pObj->x).iVal = sVar1;
        }
        else {
          (pObj->x).rVal = 0.0;
        }
        pObj->iFlags = pObj->iFlags & 0xfffffe90U | 2;
        SyBlobRelease(&pObj->sBlob);
      }
      else {
        jx9MemObjToReal(pObj);
      }
    }
  }
  else if ((pObj->iFlags & 0x28U) != 0) {
    if ((pObj->iFlags & 0x20U) != 0) {
      (pObj->x).rVal = 0.0;
    }
    pObj->iFlags = pObj->iFlags & 0xfffffe90U | 2;
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjToNumeric(jx9_value *pObj)
{
	if( pObj->iFlags & (MEMOBJ_INT|MEMOBJ_REAL|MEMOBJ_BOOL|MEMOBJ_NULL) ){
		if( pObj->iFlags & (MEMOBJ_BOOL|MEMOBJ_NULL) ){
			if( pObj->iFlags & MEMOBJ_NULL ){
				pObj->x.iVal = 0;
			}
			MemObjSetType(pObj, MEMOBJ_INT);
		}
		/* Already numeric */
		return  SXRET_OK;
	}
	if( pObj->iFlags & MEMOBJ_STRING ){
		sxi32 rc = SXERR_INVALID;
		sxu8 bReal = FALSE;
		SyString sString;
		SyStringInitFromBuf(&sString, SyBlobData(&pObj->sBlob), SyBlobLength(&pObj->sBlob));
		/* Check if the given string looks like a numeric number */
		if( sString.nByte > 0 ){
			rc = SyStrIsNumeric(sString.zString, sString.nByte, &bReal, 0);
		}
		if( bReal ){
			jx9MemObjToReal(&(*pObj));
		}else{
			if( rc != SXRET_OK ){
				/* The input does not look at all like a number, set the value to 0 */
				pObj->x.iVal = 0;
			}else{
				/* Convert as much as we can */
				pObj->x.iVal = MemObjStringToInt(&(*pObj));
			}
			MemObjSetType(pObj, MEMOBJ_INT);
			SyBlobRelease(&pObj->sBlob);
		}
	}else if(pObj->iFlags & (MEMOBJ_HASHMAP|MEMOBJ_RES)){
		jx9MemObjToInteger(pObj);
	}else{
		/* Perform a blind cast */
		jx9MemObjToReal(&(*pObj));
	}
	return SXRET_OK;
}